

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<google::protobuf::FieldDescriptor_const*,unsigned_long>::
     transfer<std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>>
               (allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long> *ppVar1;
  undefined1 local_21;
  slot_type *psStack_20;
  type is_relocatable;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_> *alloc_local;
  
  psStack_20 = old_slot;
  memset(&local_21,0,1);
  map_slot_policy<const_google::protobuf::FieldDescriptor_*,_unsigned_long>::emplace(new_slot);
  ppVar1 = std::launder<std::pair<google::protobuf::FieldDescriptor_const*const,unsigned_long>>
                     (&new_slot->value);
  ppVar1->first = (psStack_20->value).first;
  ppVar1->second = (psStack_20->value).second;
  return;
}

Assistant:

static auto transfer(Allocator* alloc, slot_type* new_slot,
                       slot_type* old_slot) {
    auto is_relocatable =
        typename absl::is_trivially_relocatable<value_type>::type();

    emplace(new_slot);
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
    if (is_relocatable) {
      // TODO(b/247130232,b/251814870): remove casts after fixing warnings.
      std::memcpy(static_cast<void*>(std::launder(&new_slot->value)),
                  static_cast<const void*>(&old_slot->value),
                  sizeof(value_type));
      return is_relocatable;
    }
#endif

    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                   std::move(old_slot->value));
    }
    destroy(alloc, old_slot);
    return is_relocatable;
  }